

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

int __thiscall
notch::core::FixedRate::clone
          (FixedRate *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  float learningRate;
  float momentum;
  float weightDecay;
  FixedRate *this_00;
  float wd;
  float m;
  float lr;
  FixedRate *this_local;
  unique_ptr<notch::core::ALearningPolicy,_std::default_delete<notch::core::ALearningPolicy>_> *c;
  
  learningRate = *(float *)(__fn + 8);
  momentum = *(float *)(__fn + 0xc);
  weightDecay = *(float *)(__fn + 0x10);
  this_00 = (FixedRate *)operator_new(0x38);
  FixedRate(this_00,learningRate,momentum,weightDecay);
  ::std::unique_ptr<notch::core::ALearningPolicy,std::default_delete<notch::core::ALearningPolicy>>
  ::unique_ptr<std::default_delete<notch::core::ALearningPolicy>,void>
            ((unique_ptr<notch::core::ALearningPolicy,std::default_delete<notch::core::ALearningPolicy>>
              *)this,(pointer)this_00);
  return (int)this;
}

Assistant:

virtual std::unique_ptr<ALearningPolicy> clone() const {
        float lr = learningRate;
        float m = momentum;
        float wd = weightDecay;
        auto c = std::unique_ptr<ALearningPolicy>(new FixedRate(lr, m, wd));
        return c;
    }